

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

void __thiscall boost::runtime::option::value_help(option *this,ostream *ostr)

{
  if ((this->super_basic_param).p_value_hint._M_string_length != 0) {
    std::operator<<(ostr,(string *)&(this->super_basic_param).p_value_hint);
    return;
  }
  std::operator<<(ostr,"<boolean value>");
  return;
}

Assistant:

virtual void    value_help( std::ostream& ostr ) const
    {
        if( p_value_hint.empty() )
            ostr << "<boolean value>";
        else
            ostr << p_value_hint;
    }